

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b3D_integrator.cpp
# Opt level: O0

void __thiscall
NetworkNS::cb3D_integrator::calculate_pressure(cb3D_integrator *this,double *press_tens)

{
  uint local_28;
  uint local_24;
  uint j_2;
  uint j_1;
  uint i;
  uint j;
  double *press_tens_local;
  cb3D_integrator *this_local;
  
  for (j_1 = 0; j_1 < 6; j_1 = j_1 + 1) {
    press_tens[j_1] = 0.0;
  }
  for (j_2 = 0; j_2 < this->dofs; j_2 = j_2 + 1) {
    for (local_24 = 0; local_24 < 6; local_24 = local_24 + 1) {
      press_tens[local_24] = this->bd_stress[j_2][local_24] + press_tens[local_24];
    }
  }
  for (local_28 = 0; local_28 < 6; local_28 = local_28 + 1) {
    press_tens[local_28] = press_tens[local_28] * 16388.244964541722;
  }
  return;
}

Assistant:

void cb3D_integrator::calculate_pressure(double *press_tens){
      /** A function which accumulates the per-atom stresses in order to calculate the pressure
       *  of the simulation box.
       */

      // Initialize the pressure tensor to zero.
      for (unsigned int j = 0; j < 6; j++)
         press_tens[j] = 0.0;
      
      /** The per-atom stress is the negative of the per-atom pressure tensor. It is also really a 
       *  stress*volume formulation, meaning the computed quantity is in units of pressure*volume:
       * @f[\frac{\rm kJ}{\rm mol} = \frac{10^{33}}{6.022 \times 10^{23}} 
       *    \frac{\rm kg}{\rm m\: s^2} @f]
       * Thus, if the diagonal components of the per-atom stress tensor are summed for all beads in 
       * the system and the sum is divided by @f$3 V@f$, where @f$ V @f$  is the volume of the 
       * system, the result should be @f$ -p @f$, where @f$ p @f$ is the total pressure of the 
       * system.
       */ 
      
      // Accumulated the per-atom pressures to the global tensor:
      for (unsigned int i = 0; i < dofs; i++)
         for (unsigned int j = 0; j < 6; j++)
            press_tens[j] += bd_stress[i][j];
      
      // Convert per-atom pressure*vol in atm*Angstrom
      // An interesting thread concerning loop unrolling in C++: 
      // http://stackoverflow.com/questions/15275023/clang-force-loop-unroll-for-specific-loop
      for (unsigned int j = 0; j < 6; j++)
         press_tens[j] *= 1.e33 / avogadro_constant / 101.325e3;
      
      return;
   }